

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void nmult(double *A,double *B,double *C,int ra,int ca,int cb)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  double *pdVar6;
  ulong uVar7;
  double dVar8;
  
  if (0 < ra) {
    uVar1 = (ulong)(uint)cb;
    uVar4 = 0;
    uVar7 = 0;
    do {
      if (0 < cb) {
        uVar2 = 0;
        pdVar5 = B;
        do {
          C[uVar7 * uVar1 + uVar2] = 0.0;
          if (0 < ca) {
            dVar8 = 0.0;
            uVar3 = 0;
            pdVar6 = pdVar5;
            do {
              dVar8 = dVar8 + A[uVar4 + uVar3] * *pdVar6;
              C[uVar7 * uVar1 + uVar2] = dVar8;
              uVar3 = uVar3 + 1;
              pdVar6 = pdVar6 + uVar1;
            } while ((uint)ca != uVar3);
          }
          uVar2 = uVar2 + 1;
          pdVar5 = pdVar5 + 1;
        } while (uVar2 != uVar1);
      }
      uVar7 = uVar7 + 1;
      uVar4 = (ulong)(uint)((int)uVar4 + ca);
    } while (uVar7 != (uint)ra);
  }
  return;
}

Assistant:

void nmult(double* A, double* B, double* C,int ra,int ca, int cb) {
	register int i,j,k;
	int u,v,t,rb;
	
	/*
	 * C = A * B , where A is a ra*ca matric while B is a rb*cb
	 * with ca = rb
	 * Matrix C is a ra*cb matrix
	 */ 
	 
	rb = ca;
	#pragma omp parallel for private(i,j,k,v,u,t)
	for (i = 0; i < ra; ++i) {
		for (j = 0; j < cb; ++j) {
			v = i * rb;
			u = i *cb;
			t = j + u;
			C[t] = 0.;
			for (k = 0; k < rb;++k) {
				C[t] += A[k + v] * B[j + k * cb];
			}
		}
	}


}